

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O3

void struct_suite::fail_invalid_second(void)

{
  person value;
  value_type input [8];
  iarchive in;
  long *local_120;
  undefined8 local_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  undefined8 uStack_108;
  long *local_100;
  undefined8 local_f8;
  long local_f0;
  undefined8 uStack_e8;
  undefined4 local_e0;
  uchar local_b8 [8];
  iarchive local_b0;
  
  local_b8[0] = 0x90;
  local_b8[1] = 0xa9;
  local_b8[2] = '\x03';
  local_b8[3] = 'A';
  local_b8[4] = 'B';
  local_b8[5] = 'C';
  local_b8[6] = 0x81;
  local_b8[7] = 0x91;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[8]>(&local_b0,&local_b8);
  local_120 = (long *)&local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"");
  if (local_120 == (long *)&local_110) {
    uStack_e8 = uStack_108;
    local_100 = &local_f0;
  }
  else {
    local_100 = local_120;
  }
  local_f0 = CONCAT71(uStack_10f,local_110);
  local_f8 = local_118;
  local_118 = 0;
  local_110 = 0;
  local_e0 = 99;
  local_120 = (long *)&local_110;
  boost::serialization::
  singleton<boost::archive::detail::iserializer<trial::protocol::bintoken::iarchive,_struct_suite::person>_>
  ::get_instance();
  boost::archive::detail::basic_iarchive::load_object(&local_b0,(basic_iserializer *)&local_100);
  boost::detail::throw_failed_impl
            ("in >> value","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x299,"void struct_suite::fail_invalid_second()");
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  local_b0.super_common_iarchive<trial::protocol::bintoken::iarchive>._0_8_ = &PTR_vload_0013dfc8;
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)((long)&local_b0 + 0x50));
  boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)&local_b0);
  return;
}

Assistant:

void fail_invalid_second()
{
    const value_type input[] = { token::code::begin_record,
                                 token::code::string8, 0x03, 0x41, 0x42, 0x43,
                                 token::code::true_value,
                                 token::code::end_record };
    format::iarchive in(input);
    person value("", 99);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(in >> value,
                                    format::error, "invalid value");
}